

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_iarchive.h
# Opt level: O2

void __thiscall serialization::xml_iarchive::load_key_start(xml_iarchive *this,char *key)

{
  _Elt_pointer ppxVar1;
  xml_node<char> *node;
  
  ppxVar1 = (this->stack_).c.
            super__Deque_base<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppxVar1 ==
      (this->stack_).c.
      super__Deque_base<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    ppxVar1 = (this->stack_).c.
              super__Deque_base<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  node = rapidxml::xml_node<char>::first_node(ppxVar1[-1],key,0,true);
  if (node == (xml_node<char> *)0x0) {
    throw_serialization_error("expect key",key);
  }
  std::deque<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>::
  push_back(&(this->stack_).c,&node);
  return;
}

Assistant:

void load_key_start(const char * key) const
    {
        serialization_trace trace(__func__, key);

        auto node = stack_.top()->first_node(key);
        if(node == nullptr)
            throw_serialization_error("expect key", key);
        stack_.push(node);
    }